

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::EndColumns(void)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumns *pIVar3;
  ImGuiColumnData *pIVar4;
  ImGuiCol idx;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 col;
  ImGuiID id;
  ImGuiContext *g;
  ulong uVar8;
  int column_index;
  long lVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_ae;
  bool local_ad;
  uint local_ac;
  undefined1 local_a8 [16];
  ulong local_90;
  float local_84;
  ImGuiContext *local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect local_68;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  if (pIVar3 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x1d01,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar2->DrawList->_Splitter,pIVar2->DrawList);
  }
  local_ac = pIVar3->Flags;
  fVar11 = (pIVar2->DC).CursorPos.y;
  uVar10 = -(uint)(fVar11 <= pIVar3->LineMaxY);
  local_58 = (float)(~uVar10 & (uint)fVar11 | (uint)pIVar3->LineMaxY & uVar10);
  pIVar3->LineMaxY = local_58;
  (pIVar2->DC).CursorPos.y = local_58;
  if ((local_ac & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if ((((local_ac & 1) == 0) && (pIVar2->SkipItems == false)) && (1 < pIVar3->Count)) {
    local_80 = pIVar6;
    fVar11 = (pIVar2->ClipRect).Min.y;
    uVar10 = -(uint)(fVar11 <= pIVar3->HostCursorPosY);
    fVar12 = (pIVar2->ClipRect).Max.y;
    if (fVar12 <= local_58) {
      local_58 = fVar12;
    }
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48 = (float)(~uVar10 & (uint)fVar11 | (uint)pIVar3->HostCursorPosY & uVar10);
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_84 = local_48 + 1.0;
    local_90 = 0xffffffff;
    uVar8 = 1;
    lVar9 = 0x24;
    do {
      if ((long)(pIVar3->Columns).Size <= (long)uVar8) goto LAB_00183f57;
      pIVar4 = (pIVar3->Columns).Data;
      local_a8._0_4_ = (pIVar2->Pos).x;
      fVar11 = GetColumnOffset((int)uVar8);
      local_a8._0_4_ = fVar11 + (float)local_a8._0_4_;
      id = pIVar3->ID + (int)uVar8;
      local_68.Min.x = (float)local_a8._0_4_ + -4.0;
      local_a8._4_4_ = extraout_XMM0_Db;
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._12_4_ = extraout_XMM0_Dd;
      local_68.Max.x = (float)local_a8._0_4_ + 4.0;
      local_68.Min.y = local_48;
      local_68.Max.y = local_58;
      KeepAliveID(id);
      bVar7 = IsClippedEx(&local_68,id,false);
      if (!bVar7) {
        local_ad = false;
        local_ae = false;
        if ((local_ac & 2) == 0) {
          ButtonBehavior(&local_68,id,&local_ad,&local_ae,0);
          if (local_ad == false) {
            if ((local_ae & 1U) != 0) {
              local_80->MouseCursor = 4;
              goto LAB_00183d52;
            }
          }
          else {
            local_80->MouseCursor = 4;
            if ((local_ae & 1U) != 0) {
LAB_00183d52:
              if ((*(byte *)((long)&pIVar4->OffsetNorm + lVar9) & 2) == 0) {
                local_90 = uVar8;
              }
              local_90 = local_90 & 0xffffffff;
            }
          }
        }
        idx = local_ad + 0x1b;
        if ((local_ae & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_78.x = (float)(int)(float)local_a8._0_4_;
        local_70.y = local_84;
        local_78.y = local_58;
        local_70.x = local_78.x;
        ImDrawList::AddLine(pIVar2->DrawList,&local_70,&local_78,col,1.0);
      }
      uVar8 = uVar8 + 1;
      uVar10 = pIVar3->Count;
      lVar9 = lVar9 + 0x1c;
    } while ((long)uVar8 < (long)(int)uVar10);
    column_index = (int)local_90;
    if (column_index != -1) {
      if ((-1 < (int)uVar10) && (pIVar3->IsBeingResized == false)) {
        uVar1 = (pIVar3->Columns).Size;
        lVar9 = 0;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        do {
          if ((ulong)uVar1 * 0x1c == lVar9) {
LAB_00183f57:
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                          ,0x4d8,
                          "T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
          }
          pIVar4 = (pIVar3->Columns).Data;
          *(undefined4 *)((long)&pIVar4->OffsetNormBeforeResize + lVar9) =
               *(undefined4 *)((long)&pIVar4->OffsetNorm + lVar9);
          lVar9 = lVar9 + 0x1c;
        } while ((ulong)uVar10 * 0x1c + 0x1c != lVar9);
      }
      pIVar3->IsBeingResized = true;
      pIVar6 = GImGui;
      if (column_index < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                      ,0x1bea,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      if (GImGui->ActiveId != pIVar3->ID + column_index) {
        __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                      ,0x1beb,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      local_a8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar11 = GetColumnOffset(column_index + -1);
      fVar11 = fVar11 + (pIVar6->Style).ColumnsMinSpacing;
      uVar10 = -(uint)(fVar11 <= (float)local_a8._0_4_);
      fVar11 = (float)(~uVar10 & (uint)fVar11 | local_a8._0_4_ & uVar10);
      if ((pIVar3->Flags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar11;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        fVar12 = GetColumnOffset(column_index + 1);
        fVar12 = fVar12 - (pIVar6->Style).ColumnsMinSpacing;
        fVar11 = (float)local_a8._0_4_;
        if (fVar12 <= (float)local_a8._0_4_) {
          fVar11 = fVar12;
        }
      }
      bVar7 = column_index != -1;
      SetColumnOffset(column_index,fVar11);
      goto LAB_00183efe;
    }
  }
  bVar7 = false;
LAB_00183efe:
  pIVar3->IsBeingResized = bVar7;
  IVar5 = (pIVar3->HostWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar3->HostWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar5;
  (pIVar2->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    const ImGuiColumnsFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = columns->HostWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}